

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_26::RegistryHub::registerListener
          (RegistryHub *this,unique_ptr<Catch::EventListenerFactory> *factory)

{
  unique_ptr<Catch::EventListenerFactory> local_20;
  unique_ptr<Catch::EventListenerFactory> *local_18;
  unique_ptr<Catch::EventListenerFactory> *factory_local;
  RegistryHub *this_local;
  
  local_18 = factory;
  factory_local = (unique_ptr<Catch::EventListenerFactory> *)this;
  Detail::unique_ptr<Catch::EventListenerFactory>::unique_ptr(&local_20,factory);
  ReporterRegistry::registerListener(&this->m_reporterRegistry,&local_20);
  Detail::unique_ptr<Catch::EventListenerFactory>::~unique_ptr(&local_20);
  return;
}

Assistant:

void registerListener( Detail::unique_ptr<EventListenerFactory> factory ) override {
                m_reporterRegistry.registerListener( CATCH_MOVE(factory) );
            }